

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mipmaps_image *
rf_load_ktx_image_from_file
          (rf_mipmaps_image *__return_storage_ptr__,char *file,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_allocator_args rVar3;
  undefined1 auVar4 [24];
  _Bool _Var5;
  rf_int rVar6;
  void *src;
  long src_size;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_40.allocator_proc = temp_allocator.allocator_proc;
  local_40.user_data = temp_allocator.user_data;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->mipmaps = 0;
  (__return_storage_ptr__->field_0).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  rVar6 = (*io.file_size_proc)(io.user_data,file);
  src_size = (long)(int)rVar6;
  rVar1.proc_name = "rf_load_ktx_image_from_file";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x4674;
  auVar4._8_8_ = (ulong)uStack_5c << 0x20;
  auVar4._0_8_ = src_size;
  auVar4._16_8_ = 0;
  src = (*local_40.allocator_proc)(&local_40,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
  _Var5 = (*io.read_file_proc)(io.user_data,file,src,src_size);
  if (_Var5) {
    rf_load_ktx_image(__return_storage_ptr__,src,src_size,allocator);
  }
  rVar2.proc_name = "rf_load_ktx_image_from_file";
  rVar2.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar2.line_in_file = 0x467b;
  rVar3.size_to_allocate_or_reallocate = 0;
  rVar3.pointer_to_free_or_realloc = src;
  rVar3._16_8_ = (ulong)uStack_8c << 0x20;
  (*local_40.allocator_proc)(&local_40,rVar2,RF_AM_FREE,rVar3);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_ktx_image_from_file(const char* file, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_mipmaps_image result = {0};

    int src_size = RF_FILE_SIZE(io, file);
    void* src = RF_ALLOC(temp_allocator, src_size);

    if (RF_READ_FILE(io, file, src, src_size))
    {
        result = rf_load_ktx_image(src, src_size, allocator);
    }

    RF_FREE(temp_allocator, src);

    return result;
}